

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute(XmlWriter *this,string *name,string *attribute)

{
  ulong uVar1;
  ostream *poVar2;
  string *in_RSI;
  XmlWriter *in_RDI;
  XmlEncode *in_stack_ffffffffffffff88;
  XmlEncode *in_stack_ffffffffffffffa0;
  string local_40 [48];
  string *local_10;
  
  local_10 = in_RSI;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      poVar2 = stream(in_RDI);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = std::operator<<(poVar2,local_10);
      poVar2 = std::operator<<(poVar2,"=\"");
      XmlEncode::XmlEncode(in_stack_ffffffffffffffa0,local_40,(ForWhat)((ulong)poVar2 >> 0x20));
      poVar2 = Catch::operator<<(poVar2,in_stack_ffffffffffffff88);
      std::operator<<(poVar2,"\"");
      XmlEncode::~XmlEncode((XmlEncode *)0x1be627);
    }
  }
  return in_RDI;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, std::string const& attribute ) {
            if( !name.empty() && !attribute.empty() )
                stream() << " " << name << "=\"" << XmlEncode( attribute, XmlEncode::ForAttributes ) << "\"";
            return *this;
        }